

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear_test.cpp
# Opt level: O1

void PMPML_64_CPP(void *key,int len,uint32_t seed,void *res)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  long lVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  bool bVar95;
  
  uVar73 = (ulong)len;
  if (0x3f < (uint)len) {
    if ((uint)len < 0x80) {
      uVar73 = PMP_Multilinear_Hasher_64::_hash_noRecursionNoInline_SingleChunk
                         (&pmpml_hasher_64,(uchar *)key,uVar73);
    }
    else {
      uVar73 = PMP_Multilinear_Hasher_64::_hash_noRecursionNoInline_type2
                         (&pmpml_hasher_64,(uchar *)key,uVar73);
    }
    goto LAB_001833e6;
  }
  uVar72 = (pmpml_hasher_64.curr_rd)->const_term;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar72;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar72;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar72;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar72;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar72;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar72;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar72;
  switch(uVar73 >> 3) {
  case 1:
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *key;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[0];
    auVar1 = auVar1 * auVar31;
    auVar60 = auVar1 + auVar61;
    uVar89 = (ulong)CARRY8(auVar1._8_8_,(ulong)CARRY8(uVar72,auVar1._0_8_));
    uVar72 = 1;
    switch(len & 7) {
    case 0:
      goto switchD_001832dd_caseD_0;
    case 2:
      goto switchD_001832dd_caseD_2;
    case 3:
      goto switchD_001832dd_caseD_3;
    case 4:
      goto switchD_001832dd_caseD_4;
    case 5:
      goto switchD_001832dd_caseD_5;
    case 6:
      goto switchD_001832dd_caseD_6;
    case 7:
      goto switchD_001832dd_caseD_7;
    }
    goto switchD_001832dd_caseD_1;
  case 2:
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *key;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[0];
    auVar14 = auVar14 * auVar44;
    uVar71 = SUB168(auVar14 + auVar65,0);
    uVar93 = SUB168(auVar14 + auVar65,8);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)((long)key + 8);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[1];
    uVar92 = SUB168(auVar15 * auVar45,8);
    uVar91 = SUB168(auVar15 * auVar45,0);
    uVar89 = (ulong)CARRY8(uVar71,uVar91);
    uVar90 = uVar93 + uVar92;
    auVar60._8_8_ = uVar90 + uVar89;
    auVar60._0_8_ = uVar71 + uVar91;
    uVar89 = (ulong)CARRY8(auVar14._8_8_,(ulong)CARRY8(uVar72,auVar14._0_8_)) +
             (ulong)(CARRY8(uVar93,uVar92) || CARRY8(uVar90,uVar89));
    uVar72 = 1;
    switch(len & 7) {
    case 1:
      goto switchD_001832dd_caseD_1;
    case 2:
      goto switchD_001832dd_caseD_2;
    case 3:
      goto switchD_001832dd_caseD_3;
    case 4:
      goto switchD_001832dd_caseD_4;
    case 5:
      goto switchD_001832dd_caseD_5;
    case 6:
      goto switchD_001832dd_caseD_6;
    case 7:
      goto switchD_001832dd_caseD_7;
    }
    break;
  case 3:
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *key;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[0];
    auVar7 = auVar7 * auVar37;
    uVar90 = SUB168(auVar7 + auVar63,0);
    uVar75 = SUB168(auVar7 + auVar63,8);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(ulong *)((long)key + 8);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[1];
    uVar71 = SUB168(auVar8 * auVar38,8);
    uVar89 = SUB168(auVar8 * auVar38,0);
    uVar74 = uVar90 + uVar89;
    uVar89 = (ulong)CARRY8(uVar90,uVar89);
    uVar91 = uVar75 + uVar71;
    uVar68 = uVar91 + uVar89;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)((long)key + 0x10);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[2];
    uVar69 = SUB168(auVar9 * auVar39,8);
    uVar93 = SUB168(auVar9 * auVar39,0);
    uVar90 = (ulong)CARRY8(uVar74,uVar93);
    uVar92 = uVar68 + uVar69;
    auVar60._8_8_ = uVar92 + uVar90;
    auVar60._0_8_ = uVar74 + uVar93;
    uVar89 = (ulong)CARRY8(auVar7._8_8_,(ulong)CARRY8(uVar72,auVar7._0_8_)) +
             (ulong)(CARRY8(uVar75,uVar71) || CARRY8(uVar91,uVar89)) +
             (ulong)(CARRY8(uVar68,uVar69) || CARRY8(uVar92,uVar90));
    uVar72 = 1;
    switch(len & 7) {
    case 1:
      goto switchD_001832dd_caseD_1;
    case 2:
      goto switchD_001832dd_caseD_2;
    case 3:
      goto switchD_001832dd_caseD_3;
    case 4:
      goto switchD_001832dd_caseD_4;
    case 5:
      goto switchD_001832dd_caseD_5;
    case 6:
      goto switchD_001832dd_caseD_6;
    case 7:
      goto switchD_001832dd_caseD_7;
    }
    break;
  case 4:
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *key;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[0];
    auVar10 = auVar10 * auVar40;
    uVar90 = SUB168(auVar10 + auVar64,0);
    uVar70 = SUB168(auVar10 + auVar64,8);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)((long)key + 8);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[1];
    uVar75 = SUB168(auVar11 * auVar41,8);
    uVar89 = SUB168(auVar11 * auVar41,0);
    uVar91 = uVar90 + uVar89;
    uVar89 = (ulong)CARRY8(uVar90,uVar89);
    uVar92 = uVar70 + uVar75;
    uVar94 = uVar92 + uVar89;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *(ulong *)((long)key + 0x10);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[2];
    uVar68 = SUB168(auVar12 * auVar42,8);
    uVar90 = SUB168(auVar12 * auVar42,0);
    uVar77 = uVar91 + uVar90;
    uVar90 = (ulong)CARRY8(uVar91,uVar90);
    uVar93 = uVar94 + uVar68;
    uVar76 = uVar93 + uVar90;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)((long)key + 0x18);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[3];
    uVar74 = SUB168(auVar13 * auVar43,8);
    uVar69 = SUB168(auVar13 * auVar43,0);
    uVar91 = (ulong)CARRY8(uVar77,uVar69);
    uVar71 = uVar76 + uVar74;
    auVar60._8_8_ = uVar71 + uVar91;
    auVar60._0_8_ = uVar77 + uVar69;
    uVar89 = (ulong)CARRY8(auVar10._8_8_,(ulong)CARRY8(uVar72,auVar10._0_8_)) +
             (ulong)(CARRY8(uVar70,uVar75) || CARRY8(uVar92,uVar89)) +
             (ulong)(CARRY8(uVar94,uVar68) || CARRY8(uVar93,uVar90)) +
             (ulong)(CARRY8(uVar76,uVar74) || CARRY8(uVar71,uVar91));
    uVar72 = 1;
    switch(len & 7) {
    case 1:
      goto switchD_001832dd_caseD_1;
    case 2:
      goto switchD_001832dd_caseD_2;
    case 3:
      goto switchD_001832dd_caseD_3;
    case 4:
      goto switchD_001832dd_caseD_4;
    case 5:
      goto switchD_001832dd_caseD_5;
    case 6:
      goto switchD_001832dd_caseD_6;
    case 7:
      goto switchD_001832dd_caseD_7;
    }
    break;
  case 5:
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *key;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[0];
    auVar2 = auVar2 * auVar32;
    uVar90 = SUB168(auVar2 + auVar62,0);
    uVar77 = SUB168(auVar2 + auVar62,8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)((long)key + 8);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[1];
    uVar74 = SUB168(auVar3 * auVar33,8);
    uVar89 = SUB168(auVar3 * auVar33,0);
    uVar91 = uVar90 + uVar89;
    uVar89 = (ulong)CARRY8(uVar90,uVar89);
    uVar93 = uVar77 + uVar74;
    uVar78 = uVar93 + uVar89;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)((long)key + 0x10);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[2];
    uVar70 = SUB168(auVar4 * auVar34,8);
    uVar90 = SUB168(auVar4 * auVar34,0);
    uVar92 = uVar91 + uVar90;
    uVar90 = (ulong)CARRY8(uVar91,uVar90);
    uVar71 = uVar78 + uVar70;
    uVar79 = uVar71 + uVar90;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)((long)key + 0x18);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[3];
    uVar94 = SUB168(auVar5 * auVar35,8);
    uVar91 = SUB168(auVar5 * auVar35,0);
    uVar81 = uVar92 + uVar91;
    uVar91 = (ulong)CARRY8(uVar92,uVar91);
    uVar69 = uVar79 + uVar94;
    uVar80 = uVar69 + uVar91;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)((long)key + 0x20);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[4];
    uVar76 = SUB168(auVar6 * auVar36,8);
    uVar68 = SUB168(auVar6 * auVar36,0);
    uVar92 = (ulong)CARRY8(uVar81,uVar68);
    uVar75 = uVar80 + uVar76;
    auVar60._8_8_ = uVar75 + uVar92;
    auVar60._0_8_ = uVar81 + uVar68;
    uVar89 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar72,auVar2._0_8_)) +
             (ulong)(CARRY8(uVar77,uVar74) || CARRY8(uVar93,uVar89)) +
             (ulong)(CARRY8(uVar78,uVar70) || CARRY8(uVar71,uVar90)) +
             (ulong)(CARRY8(uVar79,uVar94) || CARRY8(uVar69,uVar91)) +
             (ulong)(CARRY8(uVar80,uVar76) || CARRY8(uVar75,uVar92));
    uVar72 = 1;
    switch(len & 7) {
    case 1:
      goto switchD_001832dd_caseD_1;
    case 2:
      goto switchD_001832dd_caseD_2;
    case 3:
      goto switchD_001832dd_caseD_3;
    case 4:
      goto switchD_001832dd_caseD_4;
    case 5:
      goto switchD_001832dd_caseD_5;
    case 6:
      goto switchD_001832dd_caseD_6;
    case 7:
      goto switchD_001832dd_caseD_7;
    }
    break;
  case 6:
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *key;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[0];
    auVar16 = auVar16 * auVar46;
    uVar90 = SUB168(auVar16 + auVar66,0);
    uVar80 = SUB168(auVar16 + auVar66,8);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *(ulong *)((long)key + 8);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[1];
    uVar94 = SUB168(auVar17 * auVar47,8);
    uVar89 = SUB168(auVar17 * auVar47,0);
    uVar91 = uVar90 + uVar89;
    uVar89 = (ulong)CARRY8(uVar90,uVar89);
    uVar71 = uVar80 + uVar94;
    uVar81 = uVar71 + uVar89;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = *(ulong *)((long)key + 0x10);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[2];
    uVar76 = SUB168(auVar18 * auVar48,8);
    uVar90 = SUB168(auVar18 * auVar48,0);
    uVar92 = uVar91 + uVar90;
    uVar90 = (ulong)CARRY8(uVar91,uVar90);
    uVar69 = uVar81 + uVar76;
    uVar82 = uVar69 + uVar90;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *(ulong *)((long)key + 0x18);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[3];
    uVar77 = SUB168(auVar19 * auVar49,8);
    uVar91 = SUB168(auVar19 * auVar49,0);
    uVar93 = uVar92 + uVar91;
    uVar91 = (ulong)CARRY8(uVar92,uVar91);
    uVar75 = uVar82 + uVar77;
    uVar83 = uVar75 + uVar91;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *(ulong *)((long)key + 0x20);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[4];
    uVar78 = SUB168(auVar20 * auVar50,8);
    uVar92 = SUB168(auVar20 * auVar50,0);
    uVar85 = uVar93 + uVar92;
    uVar92 = (ulong)CARRY8(uVar93,uVar92);
    uVar68 = uVar83 + uVar78;
    uVar84 = uVar68 + uVar92;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = *(ulong *)((long)key + 0x28);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[5];
    uVar79 = SUB168(auVar21 * auVar51,8);
    uVar70 = SUB168(auVar21 * auVar51,0);
    uVar93 = (ulong)CARRY8(uVar85,uVar70);
    uVar74 = uVar84 + uVar79;
    auVar60._8_8_ = uVar74 + uVar93;
    auVar60._0_8_ = uVar85 + uVar70;
    uVar89 = (ulong)CARRY8(auVar16._8_8_,(ulong)CARRY8(uVar72,auVar16._0_8_)) +
             (ulong)(CARRY8(uVar80,uVar94) || CARRY8(uVar71,uVar89)) +
             (ulong)(CARRY8(uVar81,uVar76) || CARRY8(uVar69,uVar90)) +
             (ulong)(CARRY8(uVar82,uVar77) || CARRY8(uVar75,uVar91)) +
             (ulong)(CARRY8(uVar83,uVar78) || CARRY8(uVar68,uVar92)) +
             (ulong)(CARRY8(uVar84,uVar79) || CARRY8(uVar74,uVar93));
    uVar72 = 1;
    switch(len & 7) {
    case 1:
      goto switchD_001832dd_caseD_1;
    case 2:
      goto switchD_001832dd_caseD_2;
    case 3:
      goto switchD_001832dd_caseD_3;
    case 4:
      goto switchD_001832dd_caseD_4;
    case 5:
      goto switchD_001832dd_caseD_5;
    case 6:
      goto switchD_001832dd_caseD_6;
    case 7:
      goto switchD_001832dd_caseD_7;
    }
    break;
  case 7:
    auVar22._8_8_ = 0;
    auVar22._0_8_ = *key;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[0];
    auVar22 = auVar22 * auVar52;
    bVar95 = CARRY8(uVar72,auVar22._0_8_);
    uVar89 = SUB168(auVar22 + auVar67,0);
    uVar82 = SUB168(auVar22 + auVar67,8);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)((long)key + 8);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[1];
    uVar76 = SUB168(auVar23 * auVar53,8);
    uVar72 = SUB168(auVar23 * auVar53,0);
    uVar90 = uVar89 + uVar72;
    uVar89 = (ulong)CARRY8(uVar89,uVar72);
    uVar69 = uVar82 + uVar76;
    uVar83 = uVar69 + uVar89;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)((long)key + 0x10);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[2];
    uVar77 = SUB168(auVar24 * auVar54,8);
    uVar72 = SUB168(auVar24 * auVar54,0);
    uVar91 = uVar90 + uVar72;
    uVar90 = (ulong)CARRY8(uVar90,uVar72);
    uVar75 = uVar83 + uVar77;
    uVar84 = uVar75 + uVar90;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *(ulong *)((long)key + 0x18);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[3];
    uVar78 = SUB168(auVar25 * auVar55,8);
    uVar72 = SUB168(auVar25 * auVar55,0);
    uVar92 = uVar91 + uVar72;
    uVar91 = (ulong)CARRY8(uVar91,uVar72);
    uVar68 = uVar84 + uVar78;
    uVar85 = uVar68 + uVar91;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)((long)key + 0x20);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[4];
    uVar79 = SUB168(auVar26 * auVar56,8);
    uVar72 = SUB168(auVar26 * auVar56,0);
    uVar93 = uVar92 + uVar72;
    uVar92 = (ulong)CARRY8(uVar92,uVar72);
    uVar74 = uVar85 + uVar79;
    uVar86 = uVar74 + uVar92;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = *(ulong *)((long)key + 0x28);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[5];
    uVar80 = SUB168(auVar27 * auVar57,8);
    uVar72 = SUB168(auVar27 * auVar57,0);
    uVar94 = uVar93 + uVar72;
    uVar93 = (ulong)CARRY8(uVar93,uVar72);
    uVar70 = uVar86 + uVar80;
    uVar87 = uVar70 + uVar93;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = *(ulong *)((long)key + 0x30);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[6];
    uVar81 = SUB168(auVar28 * auVar58,8);
    uVar71 = SUB168(auVar28 * auVar58,0);
    uVar72 = uVar94 + uVar71;
    uVar71 = (ulong)CARRY8(uVar94,uVar71);
    uVar94 = uVar87 + uVar81;
    lVar88 = uVar94 + uVar71;
    uVar89 = (ulong)CARRY8(auVar22._8_8_,(ulong)bVar95) +
             (ulong)(CARRY8(uVar82,uVar76) || CARRY8(uVar69,uVar89)) +
             (ulong)(CARRY8(uVar83,uVar77) || CARRY8(uVar75,uVar90)) +
             (ulong)(CARRY8(uVar84,uVar78) || CARRY8(uVar68,uVar91)) +
             (ulong)(CARRY8(uVar85,uVar79) || CARRY8(uVar74,uVar92)) +
             (ulong)(CARRY8(uVar86,uVar80) || CARRY8(uVar70,uVar93)) +
             (ulong)(CARRY8(uVar87,uVar81) || CARRY8(uVar94,uVar71));
    goto LAB_001832c7;
  default:
    uVar89 = 0;
    lVar88 = 0;
LAB_001832c7:
    auVar60._8_8_ = lVar88;
    auVar60._0_8_ = uVar72;
    uVar72 = 1;
    switch(len & 7) {
    case 1:
switchD_001832dd_caseD_1:
      uVar72 = (ulong)*(byte *)((long)key + (uVar73 - 1)) | 0x100;
      break;
    case 2:
switchD_001832dd_caseD_2:
      uVar72 = (ulong)*(ushort *)((long)key + (uVar73 - 2)) | 0x10000;
      break;
    case 3:
switchD_001832dd_caseD_3:
      uVar72 = (ulong)*(byte *)((long)key + (uVar73 - 1)) * 0x10000 + 0x1000000 +
               (ulong)*(ushort *)((long)key + (uVar73 - 3));
      break;
    case 4:
switchD_001832dd_caseD_4:
      uVar72 = (ulong)*(uint *)((long)key + (uVar73 - 4)) | 0x100000000;
      break;
    case 5:
switchD_001832dd_caseD_5:
      uVar72 = (ulong)CONCAT14(*(undefined1 *)((long)key + (uVar73 - 1)),
                               *(undefined4 *)((long)key + (uVar73 - 5))) | 0x10000000000;
      break;
    case 6:
switchD_001832dd_caseD_6:
      uVar72 = (ulong)CONCAT24(*(undefined2 *)((long)key + (uVar73 - 2)),
                               *(undefined4 *)((long)key + (uVar73 - 6))) | 0x1000000000000;
      break;
    case 7:
switchD_001832dd_caseD_7:
      uVar72 = (ulong)CONCAT16(*(undefined1 *)((long)key + (uVar73 - 1)),
                               CONCAT24(*(undefined2 *)((long)key + (uVar73 - 3)),
                                        *(undefined4 *)((long)key + (uVar73 - 7)))) |
               0x100000000000000;
    }
  }
switchD_001832dd_caseD_0:
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar72;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[uVar73 >> 3];
  uVar91 = SUB168(auVar29 * auVar59,8);
  uVar73 = SUB168(auVar29 * auVar59,0);
  uVar92 = auVar60._0_8_ + uVar73;
  uVar73 = (ulong)CARRY8(auVar60._0_8_,uVar73);
  uVar72 = auVar60._8_8_ + uVar91;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar72 + uVar73;
  uVar90 = SUB168(auVar30 * ZEXT816(0xd),0);
  uVar73 = (uVar89 + (CARRY8(auVar60._8_8_,uVar91) || CARRY8(uVar72,uVar73))) * 0xa9 + 0xd +
           SUB168(auVar30 * ZEXT816(0xd),8) * 0xd;
  uVar72 = uVar73 + uVar92;
  uVar89 = uVar72 - uVar90;
  uVar73 = (((ulong)CARRY8(uVar73,uVar92) + 1) - (ulong)(uVar72 < uVar90)) * -0xd + uVar89;
  if (uVar89 < 0x1a) {
    uVar72 = 0xc4ceb9fe1a85ec53;
    if (0x19 < uVar73) {
      uVar73 = (uVar73 + 0xd >> 0x21 ^ uVar73 + 0xd) * -0x3b314601e57a13ad;
      uVar73 = uVar73 >> 0x21 ^ uVar73;
      goto LAB_001833e6;
    }
  }
  else {
    uVar72 = uVar73 >> 0x21 ^ uVar73;
    uVar73 = 0xc4ceb9fe1a85ec53;
  }
  uVar73 = uVar73 * uVar72 >> 0x21 ^ uVar73 * uVar72;
LAB_001833e6:
  *(ulong *)res = uVar73;
  return;
}

Assistant:

void PMPML_64_CPP( const void * key, int len, uint32_t seed, void * res )
{
  //pmpml_hasher_64.seed (seed);
	*(uint64_t*)res = pmpml_hasher_64.hash( (const unsigned char*)key, len );
}